

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall
Lowerer::GenerateStackScriptFunctionInit
          (Lowerer *this,StackSym *stackSym,FunctionInfoPtrPtr nestedInfo)

{
  Func *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Instr *insertBeforeInstr;
  RegOpnd *dst;
  SymOpnd *pSVar4;
  intptr_t address;
  AddrOpnd *envOpnd;
  undefined1 local_50 [8];
  AutoReuseOpnd autoReuseAddressOpnd;
  
  this_00 = this->m_func;
  autoReuseAddressOpnd._16_8_ = stackSym;
  if (this_00->hasAnyStackNestedFunc == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x19dd,"(func->HasAnyStackNestedFunc())","func->HasAnyStackNestedFunc()");
    if (!bVar2) goto LAB_005c9617;
    *puVar3 = 0;
  }
  if (this->nextStackFunctionOpnd == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x19de,"(nextStackFunctionOpnd)","nextStackFunctionOpnd");
    if (!bVar2) {
LAB_005c9617:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  insertBeforeInstr = Func::GetFunctionEntryInsertionPoint(this_00);
  dst = IR::RegOpnd::New(TyUint64,this_00);
  local_50 = (undefined1  [8])0x0;
  IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_50,&dst->super_Opnd,this_00,true);
  pSVar4 = IR::SymOpnd::New((Sym *)autoReuseAddressOpnd._16_8_,TyUint64,this_00);
  InsertLea(dst,&pSVar4->super_Opnd,insertBeforeInstr);
  address = ThreadContextInfo::GetNullFrameDisplayAddr(this_00->m_threadContextInfo);
  envOpnd = IR::AddrOpnd::New(address,AddrOpndKindDynamicMisc,this_00,false,(Var)0x0);
  GenerateStackScriptFunctionInit(this,dst,nestedInfo,&envOpnd->super_Opnd,insertBeforeInstr);
  InsertMove(this->nextStackFunctionOpnd,&dst->super_Opnd,insertBeforeInstr,true);
  pSVar4 = IR::SymOpnd::New((Sym *)autoReuseAddressOpnd._16_8_,0x50,TyUint64,this_00);
  this->nextStackFunctionOpnd = &pSVar4->super_Opnd;
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_50);
  return;
}

Assistant:

void
Lowerer::GenerateStackScriptFunctionInit(StackSym * stackSym, Js::FunctionInfoPtrPtr nestedInfo)
{
    Func * func = this->m_func;
    Assert(func->HasAnyStackNestedFunc());
    Assert(nextStackFunctionOpnd);

    IR::Instr * insertBeforeInstr = func->GetFunctionEntryInsertionPoint();

    IR::RegOpnd * addressOpnd = IR::RegOpnd::New(TyMachPtr, func);
    const IR::AutoReuseOpnd autoReuseAddressOpnd(addressOpnd, func);
    InsertLea(addressOpnd, IR::SymOpnd::New(stackSym, TyMachPtr, func), insertBeforeInstr);

    // Currently we don't initialize the environment until we actually allocate the function, we also
    // walk the list of stack function when we need to box them. so we should use initialize it to NullFrameDisplay
    GenerateStackScriptFunctionInit(addressOpnd, nestedInfo,
        IR::AddrOpnd::New(func->GetThreadContextInfo()->GetNullFrameDisplayAddr(), IR::AddrOpndKindDynamicMisc, func), insertBeforeInstr);

    // Establish the next link
    InsertMove(nextStackFunctionOpnd, addressOpnd, insertBeforeInstr);
    this->nextStackFunctionOpnd = IR::SymOpnd::New(stackSym, sizeof(Js::StackScriptFunction), TyMachPtr, func);
}